

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlParserCtxtPtr xmlCreateMemoryParserCtxt(char *buffer,int size)

{
  xmlParserInputBufferPtr in;
  xmlParserInputPtr input_00;
  xmlParserInputBufferPtr buf;
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt;
  int size_local;
  char *buffer_local;
  
  if (buffer == (char *)0x0) {
    buffer_local = (char *)0x0;
  }
  else if (size < 1) {
    buffer_local = (char *)0x0;
  }
  else {
    buffer_local = (char *)xmlNewParserCtxt();
    if ((xmlParserCtxtPtr)buffer_local == (xmlParserCtxtPtr)0x0) {
      buffer_local = (char *)0x0;
    }
    else {
      in = xmlParserInputBufferCreateMem(buffer,size,XML_CHAR_ENCODING_NONE);
      if (in == (xmlParserInputBufferPtr)0x0) {
        xmlFreeParserCtxt((xmlParserCtxtPtr)buffer_local);
        buffer_local = (char *)0x0;
      }
      else {
        input_00 = xmlNewInputStream((xmlParserCtxtPtr)buffer_local);
        if (input_00 == (xmlParserInputPtr)0x0) {
          xmlFreeParserInputBuffer(in);
          xmlFreeParserCtxt((xmlParserCtxtPtr)buffer_local);
          buffer_local = (char *)0x0;
        }
        else {
          input_00->filename = (char *)0x0;
          input_00->buf = in;
          xmlBufResetInput(input_00->buf->buffer,input_00);
          inputPush((xmlParserCtxtPtr)buffer_local,input_00);
        }
      }
    }
  }
  return (xmlParserCtxtPtr)buffer_local;
}

Assistant:

xmlParserCtxtPtr
xmlCreateMemoryParserCtxt(const char *buffer, int size) {
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;
    xmlParserInputBufferPtr buf;

    if (buffer == NULL)
	return(NULL);
    if (size <= 0)
	return(NULL);

    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL)
	return(NULL);

    /* TODO: xmlParserInputBufferCreateStatic, requires some serious changes */
    buf = xmlParserInputBufferCreateMem(buffer, size, XML_CHAR_ENCODING_NONE);
    if (buf == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }

    input = xmlNewInputStream(ctxt);
    if (input == NULL) {
	xmlFreeParserInputBuffer(buf);
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }

    input->filename = NULL;
    input->buf = buf;
    xmlBufResetInput(input->buf->buffer, input);

    inputPush(ctxt, input);

    /* TODO for SML: Detect the markup type and set SML-specific fields */

    return(ctxt);
}